

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<signed_char> __thiscall wasm::WATParser::Lexer::takeS<signed_char>(Lexer *this)

{
  pointer pAVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  string_view in;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    bVar2 = CONCAT71(result.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                     ._M_payload._9_7_,
                     result.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                     ._M_payload._8_1_) + 0x80 < 0x81;
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ != 2) {
      bVar2 = CONCAT71(result.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                       ._M_payload._9_7_,
                       result.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                       ._M_payload._8_1_) < 0x80;
    }
    if (bVar2) {
      this->pos = this->pos + (long)local_40;
      pAVar1 = (this->annotations).
               super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->annotations).
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
        (this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
      }
      skipSpace(this);
      uVar3 = (ushort)(byte)result.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                            ._M_payload._8_1_;
      uVar4 = 0x100;
      goto LAB_00b92577;
    }
  }
  uVar3 = 0;
  uVar4 = 0;
LAB_00b92577:
  return (_Optional_base<signed_char,_true,_true>)
         (_Optional_base<signed_char,_true,_true>)(uVar4 | uVar3);
}

Assistant:

std::optional<T> Lexer::takeS() {
  static_assert(std::is_integral_v<T> && std::is_signed_v<T>);
  if (auto result = integer(next()); result && result->isSigned<T>()) {
    pos += result->span.size();
    advance();
    return T(result->n);
  }
  return std::nullopt;
}